

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

shared_ptr<const_fasttext::DenseMatrix> __thiscall
fasttext::FastText::getOutputMatrix(FastText *this)

{
  runtime_error *this_00;
  long *in_RSI;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined1 auVar2 [16];
  shared_ptr<const_fasttext::DenseMatrix> sVar3;
  
  if (((char)in_RSI[0xd] == '\x01') && (*(char *)(*in_RSI + 0x110) == '\x01')) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Can\'t export quantized matrix");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (in_RSI[6] != 0) {
    p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    auVar2 = __dynamic_cast(in_RSI[6],&Matrix::typeinfo,&DenseMatrix::typeinfo,0);
    sVar3.super___shared_ptr<const_fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = auVar2._8_8_;
    if (auVar2._0_8_ != (element_type *)0x0) {
      p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI[7];
      if (p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      }
    }
    (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         auVar2._0_8_;
    (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var1;
    sVar3.super___shared_ptr<const_fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<const_fasttext::DenseMatrix>)
           sVar3.super___shared_ptr<const_fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>;
  }
  __assert_fail("output_.get()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/asd5510[P]fastText-chinese-word2vec-optimization/src/fasttext.cc"
                ,0x5a,
                "std::shared_ptr<const DenseMatrix> fasttext::FastText::getOutputMatrix() const");
}

Assistant:

std::shared_ptr<const DenseMatrix> FastText::getOutputMatrix() const {
  if (quant_ && args_->qout) {
    throw std::runtime_error("Can't export quantized matrix");
  }
  assert(output_.get());
  return std::dynamic_pointer_cast<DenseMatrix>(output_);
}